

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::SchemaParser::ModuleImpl::embedRelative
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,ModuleImpl *this,
          StringPtr embedPath)

{
  SchemaFile *pSVar1;
  Own<capnp::SchemaFile> *pOVar2;
  Array<const_char> local_98;
  Array<const_unsigned_char> local_80;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Maybe<kj::Own<capnp::SchemaFile>_> local_48;
  undefined1 local_38 [8];
  OwnOwn<capnp::SchemaFile> importedFile;
  ModuleImpl *this_local;
  StringPtr embedPath_local;
  
  importedFile.value.ptr = (SchemaFile *)this;
  pSVar1 = kj::Own<const_capnp::SchemaFile>::operator->(&this->file);
  this_local._0_4_ = embedPath.content.ptr._0_4_;
  this_local._4_4_ = embedPath.content.ptr._4_4_;
  embedPath_local.content.ptr._0_4_ = (undefined4)embedPath.content.size_;
  embedPath_local.content.ptr._4_4_ = embedPath.content.size_._4_4_;
  local_58 = this_local._0_4_;
  uStack_54 = this_local._4_4_;
  uStack_50 = embedPath_local.content.ptr._0_4_;
  uStack_4c = embedPath_local.content.ptr._4_4_;
  (*pSVar1->_vptr_SchemaFile[2])(&local_48,pSVar1,embedPath.content.ptr,embedPath.content.size_);
  kj::_::readMaybe<capnp::SchemaFile>((_ *)local_38,&local_48);
  kj::Maybe<kj::Own<capnp::SchemaFile>_>::~Maybe(&local_48);
  pOVar2 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_38);
  if (pOVar2 == (Own<capnp::SchemaFile> *)0x0) {
    kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    pOVar2 = kj::_::OwnOwn<capnp::SchemaFile>::operator->((OwnOwn<capnp::SchemaFile> *)local_38);
    pSVar1 = kj::Own<capnp::SchemaFile>::get(pOVar2);
    (*pSVar1->_vptr_SchemaFile[1])(&local_98);
    kj::Array<const_char>::releaseAsBytes(&local_80,&local_98);
    kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__,&local_80);
    kj::Array<const_unsigned_char>::~Array(&local_80);
    kj::Array<const_char>::~Array(&local_98);
  }
  kj::_::OwnOwn<capnp::SchemaFile>::~OwnOwn((OwnOwn<capnp::SchemaFile> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    KJ_IF_MAYBE(importedFile, file->import(embedPath)) {
      return importedFile->get()->readContent().releaseAsBytes();
    } else {
      return nullptr;
    }
  }